

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O2

void __thiscall StackSym::SetIsInt64Const(StackSym *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x14f,"(this->m_isSingleDef)","this->m_isSingleDef");
    if (!bVar2) goto LAB_005b7d7c;
    *puVar3 = 0;
  }
  if ((this->field_5).m_instrDef == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x150,"(this->m_instrDef)","this->m_instrDef");
    if (!bVar2) {
LAB_005b7d7c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *(uint *)&this->field_0x18 = *(uint *)&this->field_0x18 & 0xfffffa47 | 0x88;
  return;
}

Assistant:

void StackSym::SetIsInt64Const()
{
    Assert(this->m_isSingleDef);
    Assert(this->m_instrDef);
    this->m_isConst = true;
    this->m_isInt64Const = true;
    this->m_isIntConst = false;
    this->m_isTaggableIntConst = false;
    this->m_isFltConst = false;
    this->m_isStrConst = false;
}